

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTChannel.cpp
# Opt level: O2

bool LTACMasterdataChannel::RequestMasterData(FDKeyTy *keyAc,string *callSign,double distance)

{
  bool bVar1;
  unsigned_long d;
  acStatUpdateTy acUpd;
  string local_a0;
  acStatUpdateTy local_80;
  
  bVar1 = false;
  if (((keyAc->key)._M_string_length != 0) && (bVar1 = false, keyAc->eKeyType == KEY_ICAO)) {
    d = 0xffffffff;
    if (!NAN(distance)) {
      d = (long)(distance - 9.223372036854776e+18) & (long)distance >> 0x3f | (long)distance;
    }
    str_toupper_c(&local_a0,callSign);
    acStatUpdateTy::acStatUpdateTy(&local_80,keyAc,&local_a0,d);
    std::__cxx11::string::~string((string *)&local_a0);
    bVar1 = PassOnRequest((LTACMasterdataChannel *)0x0,&local_80);
    acStatUpdateTy::~acStatUpdateTy(&local_80);
  }
  return bVar1;
}

Assistant:

bool LTACMasterdataChannel::RequestMasterData (const LTFlightData::FDKeyTy& keyAc,
                                               const std::string& callSign,
                                               double distance)
{
    // Sanity check
    if (keyAc.empty() || keyAc.eKeyType != LTFlightData::KEY_ICAO) return false;
    
    // Prepare the request object that is to be added later
    const unsigned long dist = std::isnan(distance) ? UINT_MAX : (unsigned long) (distance);
    const acStatUpdateTy acUpd (keyAc,str_toupper_c(callSign),dist);

    // Pass the request to the first channel of our list
    return PassOnRequest(nullptr, acUpd);
}